

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

Gia_Man_t * Gia_ManStart(int nObjsMax)

{
  Gia_Man_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  Gia_Man_t *p;
  int nObjsMax_local;
  
  if (0 < nObjsMax) {
    pGVar1 = (Gia_Man_t *)calloc(1,1000);
    pGVar1->nObjsAlloc = nObjsMax;
    pGVar2 = (Gia_Obj_t *)calloc((long)nObjsMax,0xc);
    pGVar1->pObjs = pGVar2;
    *(ulong *)pGVar1->pObjs = *(ulong *)pGVar1->pObjs & 0xe0000000ffffffff | 0x1fffffff00000000;
    *(ulong *)pGVar1->pObjs = *(ulong *)pGVar1->pObjs & 0xffffffffe0000000 | 0x1fffffff;
    pGVar1->nObjs = 1;
    pVVar3 = Vec_IntAlloc(nObjsMax / 0x14);
    pGVar1->vCis = pVVar3;
    pVVar3 = Vec_IntAlloc(nObjsMax / 0x14);
    pGVar1->vCos = pVVar3;
    return pGVar1;
  }
  __assert_fail("nObjsMax > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                ,0x3c,"Gia_Man_t *Gia_ManStart(int)");
}

Assistant:

Gia_Man_t * Gia_ManStart( int nObjsMax )
{
    Gia_Man_t * p;
    assert( nObjsMax > 0 );
    p = ABC_CALLOC( Gia_Man_t, 1 );
    p->nObjsAlloc = nObjsMax;
    p->pObjs = ABC_CALLOC( Gia_Obj_t, nObjsMax );
    p->pObjs->iDiff0 = p->pObjs->iDiff1 = GIA_NONE;
    p->nObjs = 1;
    p->vCis  = Vec_IntAlloc( nObjsMax / 20 );
    p->vCos  = Vec_IntAlloc( nObjsMax / 20 );
    return p;
}